

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DGXMLScanner::sendCharData(DGXMLScanner *this,XMLBuffer *toSend)

{
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  XMLSize_t XVar5;
  StackElem *pSVar6;
  XMLReader *this_00;
  CharDataOpts charOpts;
  StackElem *topElem;
  XMLSize_t len;
  XMLCh *rawBuf;
  XMLBuffer *toSend_local;
  DGXMLScanner *this_local;
  
  bVar2 = XMLBuffer::isEmpty(toSend);
  if (!bVar2) {
    if (((this->super_XMLScanner).fValidate & 1U) == 0) {
      if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
        pXVar1 = (this->super_XMLScanner).fDocHandler;
        pXVar4 = XMLBuffer::getRawBuffer(toSend);
        XVar5 = XMLBuffer::getLen(toSend);
        (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,pXVar4,XVar5,0);
      }
    }
    else {
      pXVar4 = XMLBuffer::getRawBuffer(toSend);
      XVar5 = XMLBuffer::getLen(toSend);
      pSVar6 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
      iVar3 = (*(pSVar6->fThisElement->super_XSerializable)._vptr_XSerializable[6])();
      if (iVar3 == 0) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
      }
      else {
        this_00 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar2 = XMLReader::isAllSpaces(this_00,pXVar4,XVar5);
        if (bVar2) {
          if (iVar3 == 1) {
            if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
              pXVar1 = (this->super_XMLScanner).fDocHandler;
              (*pXVar1->_vptr_XMLDocumentHandler[8])(pXVar1,pXVar4,XVar5,0);
            }
          }
          else if ((iVar3 == 2) &&
                  ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0)) {
            pXVar1 = (this->super_XMLScanner).fDocHandler;
            (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,pXVar4,XVar5,0);
          }
        }
        else if (iVar3 == 2) {
          if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
            pXVar1 = (this->super_XMLScanner).fDocHandler;
            (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,pXVar4,XVar5,0);
          }
        }
        else {
          XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
        }
      }
    }
    XMLBuffer::reset(toSend);
  }
  return;
}

Assistant:

void DGXMLScanner::sendCharData(XMLBuffer& toSend)
{
    // If no data in the buffer, then nothing to do
    if (toSend.isEmpty())
        return;

    //  We do different things according to whether we are validating or
    //  not. If not, its always just characters; else, it depends on the
    //  current element's content model.
    if (fValidate)
    {
        // Get the raw data we need for the callback
        const XMLCh* const rawBuf = toSend.getRawBuffer();
        const XMLSize_t len = toSend.getLen();

        // And see if the current element is a 'Children' style content model
        const ElemStack::StackElem* topElem = fElemStack.topElement();

        // Get the character data opts for the current element
        XMLElementDecl::CharDataOpts charOpts = topElem->fThisElement->getCharDataOpts();

        if (charOpts == XMLElementDecl::NoCharData)
        {
            // They definitely cannot handle any type of char data
            fValidator->emitError(XMLValid::NoCharDataInCM);
        }
        else if (fReaderMgr.getCurrentReader()->isAllSpaces(rawBuf, len))
        {
            //  Its all spaces. So, if they can take spaces, then send it
            //  as ignorable whitespace. If they can handle any char data
            //  send it as characters.
            if (charOpts == XMLElementDecl::SpacesOk) {
                if (fDocHandler)
                    fDocHandler->ignorableWhitespace(rawBuf, len, false);
            }
            else if (charOpts == XMLElementDecl::AllCharData)
            {
                if (fDocHandler)
                    fDocHandler->docCharacters(rawBuf, len, false);
            }
        }
        else
        {
            //  If they can take any char data, then send it. Otherwise, they
            //  can only handle whitespace and can't handle this stuff so
            //  issue an error.
            if (charOpts == XMLElementDecl::AllCharData)
            {
                if (fDocHandler)
                    fDocHandler->docCharacters(rawBuf, len, false);
            }
            else
            {
                fValidator->emitError(XMLValid::NoCharDataInCM);
            }
        }
    }
    else
    {
        // Always assume its just char data if not validating
        if (fDocHandler)
            fDocHandler->docCharacters(toSend.getRawBuffer(), toSend.getLen(), false);
    }

    // Reset buffer
    toSend.reset();
}